

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

any * __thiscall hwnet::TCPSocket::GetUserData(TCPSocket *this)

{
  std::mutex::lock(&this->mtx);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return &this->ud;
}

Assistant:

const any& GetUserData() const {
		std::lock_guard<std::mutex> guard(this->mtx);
		return this->ud;
	}